

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboTestUtil.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::FboTestUtil::FlatColorShader::shadeFragments(FlatColorShader *this)

{
  FragmentShadingContext *in_RCX;
  int in_EDX;
  FragmentPacket *in_RSI;
  
  shadeFragments((FlatColorShader *)
                 &this[-1].super_ShaderProgram.m_attributeNames.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,in_RSI,in_EDX,in_RCX);
  return;
}

Assistant:

void FlatColorShader::shadeFragments (rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
{
	const tcu::Vec4		color	(m_uniforms[0].value.f4);
	const tcu::IVec4	icolor	= castVectorSaturate<deInt32>(color);
	const tcu::UVec4	uicolor	= castVectorSaturate<deUint32>(color);

	DE_UNREF(packets);

	if (m_outputType == glu::TYPE_FLOAT_VEC4)
	{
		for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
		for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
			rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, color);
	}
	else if (m_outputType == glu::TYPE_INT_VEC4)
	{
		for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
		for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
			rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, icolor);
	}
	else if (m_outputType == glu::TYPE_UINT_VEC4)
	{
		for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
		for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
			rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, uicolor);
	}
	else
		DE_ASSERT(DE_FALSE);
}